

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

void __thiscall xe::TestSet::addGroup(TestSet *this,TestGroup *testGroup)

{
  TestGroup *testGroup_local;
  TestSet *this_local;
  
  addNodeAndParents((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
                     *)this,&testGroup->super_TestNode);
  addChildren((set<const_xe::TestNode_*,_std::less<const_xe::TestNode_*>,_std::allocator<const_xe::TestNode_*>_>
               *)this,testGroup);
  return;
}

Assistant:

void TestSet::addGroup (const TestGroup* testGroup)
{
	addNodeAndParents(m_set, testGroup);
	addChildren(m_set, testGroup);
}